

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O1

int has_best_pred_mv_sad(MV_REFERENCE_FRAME *ref_frame,MACROBLOCK *x)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  iVar1 = x->best_pred_mv_sad[0];
  uVar3 = 0;
  if ((iVar1 != 0x7fffffff) && (iVar2 = x->best_pred_mv_sad[1], iVar2 != 0x7fffffff)) {
    bVar5 = true;
    bVar4 = true;
    if (x->pred_mv_sad[*ref_frame] != iVar1) {
      bVar4 = x->pred_mv_sad[ref_frame[1]] == iVar1;
    }
    if (x->pred_mv_sad[*ref_frame] != iVar2) {
      bVar5 = x->pred_mv_sad[ref_frame[1]] == iVar2;
    }
    uVar3 = (uint)(byte)(bVar4 & bVar5);
  }
  return uVar3;
}

Assistant:

static inline int has_best_pred_mv_sad(const MV_REFERENCE_FRAME *ref_frame,
                                       const MACROBLOCK *const x) {
  int has_best_past_pred_mv_sad = 0;
  int has_best_future_pred_mv_sad = 0;
  if (x->best_pred_mv_sad[0] < INT_MAX && x->best_pred_mv_sad[1] < INT_MAX) {
    has_best_past_pred_mv_sad =
        (x->pred_mv_sad[ref_frame[0]] == x->best_pred_mv_sad[0]) ||
        (x->pred_mv_sad[ref_frame[1]] == x->best_pred_mv_sad[0]);
    has_best_future_pred_mv_sad =
        (x->pred_mv_sad[ref_frame[0]] == x->best_pred_mv_sad[1]) ||
        (x->pred_mv_sad[ref_frame[1]] == x->best_pred_mv_sad[1]);
  }
  return (has_best_past_pred_mv_sad && has_best_future_pred_mv_sad);
}